

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> * __thiscall
Lib::OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator>::operator=
          (OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *this,
          OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *other)

{
  int *piVar1;
  IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *pIVar2;
  Node *pNVar3;
  size_t sVar4;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *pVVar5;
  bool bVar6;
  ulong uVar7;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *pVVar8;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *pVVar9;
  
  if (this->_isSome == true) {
    pVVar8 = *(VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> **)
              ((long)&(this->_elem)._elem + 0x10);
    for (pVVar9 = (this->_elem)._elem.init._nodeIterators._cursor; pVVar9 != pVVar8;
        pVVar9 = pVVar9 + -1) {
      pIVar2 = pVVar9[-1]._core;
      if (pIVar2 != (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
                    0x0) {
        piVar1 = &pIVar2->_refCnt;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*pIVar2->_vptr_IteratorCore[1])(pIVar2);
          pVVar8 = *(VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>
                     **)((long)&(this->_elem)._elem + 0x10);
        }
      }
    }
    if (pVVar8 != (VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
                  0x0) {
      uVar7 = (this->_elem)._elem.init._nodeIterators._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar7 == 0) {
        pVVar8->_core =
             (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
             GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pVVar8;
      }
      else if (uVar7 < 0x11) {
        pVVar8->_core =
             (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
             GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pVVar8;
      }
      else if (uVar7 < 0x19) {
        pVVar8->_core =
             (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
             GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pVVar8;
      }
      else if (uVar7 < 0x21) {
        pVVar8->_core =
             (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
             GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pVVar8;
      }
      else if (uVar7 < 0x31) {
        pVVar8->_core =
             (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
             GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pVVar8;
      }
      else if (uVar7 < 0x41) {
        pVVar8->_core =
             (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)
             GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pVVar8;
      }
      else {
        operator_delete(pVVar8,0x10);
      }
    }
  }
  bVar6 = other->_isSome;
  if (bVar6 == true) {
    pNVar3 = (other->_elem)._elem.init._curr;
    sVar4 = (other->_elem)._elem.init._nodeIterators._capacity;
    (other->_elem)._elem.init._nodeIterators._capacity = 0;
    pVVar9 = (other->_elem)._elem.init._nodeIterators._end;
    (other->_elem)._elem.init._nodeIterators._end =
         (VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)0x0;
    (this->_elem)._elem.init._nodeIterators._capacity = sVar4;
    pVVar8 = (other->_elem)._elem.init._nodeIterators._stack;
    pVVar5 = (other->_elem)._elem.init._nodeIterators._cursor;
    (other->_elem)._elem.init._nodeIterators._stack =
         (VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)0x0;
    (other->_elem)._elem.init._nodeIterators._cursor =
         (VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)0x0;
    (this->_elem)._elem.init._curr = pNVar3;
    (this->_elem)._elem.init._nodeIterators._end = pVVar9;
    (this->_elem)._elem.init._nodeIterators._stack = pVVar8;
    (this->_elem)._elem.init._nodeIterators._cursor = pVVar5;
    bVar6 = other->_isSome;
  }
  this->_isSome = bVar6;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }